

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

realtype N_VL1Norm_SensWrapper(N_Vector x)

{
  int i;
  long lVar1;
  realtype rVar2;
  realtype rVar3;
  
  rVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    rVar3 = N_VL1Norm(*(N_Vector *)(*x->content + lVar1 * 8));
    if (rVar3 <= rVar2) {
      rVar3 = rVar2;
    }
    rVar2 = rVar3;
  }
  return rVar2;
}

Assistant:

realtype N_VL1Norm_SensWrapper(N_Vector x)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VL1Norm(NV_VEC_SW(x,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}